

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  uchar (*pk_parity) [4];
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  uchar auVar4 [4];
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  FILE *__stream;
  size_t sVar11;
  secp256k1_ge *psVar12;
  secp256k1_gej *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_scratch *scratch;
  byte *pbVar15;
  secp256k1_fe *psVar16;
  long lVar17;
  int *overflow;
  byte *pbVar18;
  ulong uVar19;
  size_t len;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  secp256k1_context *extraout_RDX;
  uint uVar20;
  undefined1 *puVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  uint64_t *puVar25;
  undefined8 *puVar26;
  byte *pbVar27;
  secp256k1_context *psVar28;
  secp256k1_context *psVar29;
  secp256k1_context *psVar30;
  ulong uVar31;
  uint64_t uVar32;
  secp256k1_scalar sVar33;
  secp256k1_ge_storage (*r_00) [2];
  long lVar34;
  undefined1 *puVar35;
  uint uVar36;
  char *pcVar37;
  uchar *puVar38;
  secp256k1_keypair *keypair;
  secp256k1_ge *a;
  undefined1 *puVar39;
  secp256k1_xonly_pubkey *psVar40;
  bool bVar41;
  byte bVar42;
  secp256k1_fe i;
  secp256k1_gej rj;
  secp256k1_ge p;
  FILE *pFStack_1c68;
  ulong uStack_1c60;
  secp256k1_context *psStack_1c58;
  undefined1 *puStack_1c50;
  ulong uStack_1c48;
  uchar auStack_1c3c [4];
  ulong uStack_1c38;
  undefined1 *puStack_1c30;
  secp256k1_context *psStack_1c28;
  undefined1 auStack_1c20 [16];
  undefined1 auStack_1c10 [16];
  undefined1 auStack_1bf0 [16];
  undefined1 auStack_1be0 [16];
  undefined1 auStack_1bd0 [16];
  undefined4 uStack_1bc0;
  undefined1 auStack_1bb0 [56];
  secp256k1_scalar sStack_1b78;
  uint uStack_1b74;
  undefined1 auStack_1b70 [48];
  undefined1 auStack_1b40 [16];
  undefined1 auStack_1b30 [16];
  uint64_t uStack_1b18;
  _func_void_char_ptr_void_ptr *p_Stack_1b10;
  undefined1 *puStack_1b08;
  secp256k1_callback sStack_1b00;
  undefined1 auStack_1af0 [16];
  undefined1 auStack_1ae0 [16];
  secp256k1_callback sStack_1ad0;
  undefined1 auStack_19a0 [32];
  byte abStack_1980 [8];
  undefined8 auStack_1978 [3];
  undefined1 auStack_1960 [16];
  undefined1 auStack_1950 [16];
  uint64_t uStack_1940;
  int iStack_1934;
  secp256k1_keypair sStack_16c0;
  secp256k1_context asStack_1660 [5];
  undefined1 auStack_11e0 [16];
  undefined1 auStack_11d0 [16];
  uint64_t uStack_11c0;
  uint64_t uStack_11b8;
  undefined1 auStack_11b0 [32];
  uint64_t uStack_1190;
  uint64_t uStack_1188;
  int iStack_1180;
  undefined1 auStack_ee0 [1248];
  secp256k1_ge sStack_a00;
  undefined1 auStack_998 [8];
  undefined1 auStack_990 [152];
  secp256k1_context asStack_8f8 [9];
  secp256k1_context *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_context *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_scalar *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_fe *local_1a0;
  undefined1 local_198 [24];
  uint64_t uStack_180;
  uint64_t local_178;
  int local_170;
  int local_16c;
  secp256k1_fe local_168;
  undefined1 local_138 [24];
  uint64_t uStack_120;
  uint64_t local_118;
  int local_110;
  int local_10c;
  secp256k1_fe local_d8;
  int local_a8;
  int local_38;
  
  bVar42 = 0;
  psVar29 = (secp256k1_context *)local_198;
  pcStack_1b0 = (code *)0x1159e1;
  secp256k1_fe_sqr((secp256k1_fe *)psVar29,n);
  pcStack_1b0 = (code *)0x1159ef;
  secp256k1_fe_mul((secp256k1_fe *)psVar29,(secp256k1_fe *)psVar29,n);
  local_1a0 = r;
  if (d == (secp256k1_fe *)0x0) {
    pcStack_1b0 = (code *)0x115ba7;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    local_198._0_8_ = local_198._0_8_ + 2;
    local_170 = local_170 + 1;
    local_16c = 0;
    pcStack_1b0 = (code *)0x115bbd;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    if (known_on_curve == 0) {
      psVar16 = (secp256k1_fe *)local_198;
LAB_00115bc6:
      pcStack_1b0 = (code *)0x115bcb;
      iVar5 = secp256k1_fe_is_square_var(psVar16);
      if (iVar5 == 0) {
        return 0;
      }
    }
LAB_00115bd3:
    r = (secp256k1_fe *)local_198;
    pcStack_1b0 = (code *)0x115beb;
    secp256k1_fe_mul((secp256k1_fe *)&stack0xffffffffffffff68,r,n);
    n = (secp256k1_fe *)&stack0xffffffffffffff98;
    pcStack_1b0 = (code *)0x115bfe;
    psStack_1c58 = (secp256k1_context *)r;
    secp256k1_fe_sqr(n,r);
    local_38 = 0;
    pcStack_1b0 = (code *)0x115c0f;
    psVar28 = (secp256k1_context *)q;
    secp256k1_scalar_verify(q);
    if (*q == 0) {
      pcStack_1b0 = (code *)0x115cbe;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      r = (secp256k1_fe *)local_138;
      psStack_1c58 = (secp256k1_context *)&stack0xffffffffffffff68;
      pcStack_1b0 = (code *)0x115c31;
      secp256k1_ecmult_const((secp256k1_gej *)r,(secp256k1_ge *)psStack_1c58,q);
      pcStack_1b0 = (code *)0x115c39;
      psVar28 = (secp256k1_context *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_a8 == 0) {
        pcStack_1b0 = (code *)0x115c57;
        secp256k1_fe_sqr(&local_168,&local_d8);
        pcStack_1b0 = (code *)0x115c67;
        secp256k1_fe_mul(&local_168,&local_168,(secp256k1_fe *)local_198);
        if (d != (secp256k1_fe *)0x0) {
          pcStack_1b0 = (code *)0x115c7c;
          secp256k1_fe_mul(&local_168,&local_168,d);
        }
        pcStack_1b0 = (code *)0x115c8c;
        secp256k1_fe_inv(&local_168,&local_168);
        pcStack_1b0 = (code *)0x115c9e;
        secp256k1_fe_mul(local_1a0,(secp256k1_fe *)local_138,&local_168);
        return 1;
      }
    }
    pcStack_1b0 = (code *)0x115cc3;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00115cc3:
    uVar20 = (uint)psVar28;
    pcStack_1b0 = (code *)0x115cc8;
    secp256k1_ecmult_const_xonly_cold_1();
LAB_00115cc8:
    pcStack_1b0 = (code *)0x115ccd;
    secp256k1_ecmult_const_xonly_cold_3();
  }
  else {
    pcStack_1b0 = (code *)0x115a05;
    secp256k1_fe_verify(d);
    uVar9 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar19 = (uVar9 >> 0x34) + d->n[1];
    psStack_1c58 = (secp256k1_context *)((uVar19 >> 0x34) + d->n[2]);
    psVar28 = (secp256k1_context *)(((ulong)psStack_1c58 >> 0x34) + d->n[3]);
    uVar31 = ((ulong)psVar28 >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar19 | uVar9 | (ulong)psStack_1c58 | (ulong)psVar28) & 0xfffffffffffff) == 0 &&
         uVar31 == 0) ||
       (((uVar9 ^ 0x1000003d0) & uVar19 & (ulong)psStack_1c58 & (ulong)psVar28 &
        (uVar31 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00115cc3;
    psVar29 = (secp256k1_context *)local_138;
    pcStack_1b0 = (code *)0x115ab1;
    psStack_1c58 = (secp256k1_context *)d;
    secp256k1_fe_sqr((secp256k1_fe *)psVar29,d);
    pcStack_1b0 = (code *)0x115ab9;
    psVar28 = psVar29;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    uVar20 = (uint)psVar28;
    if (0x10 < local_110) goto LAB_00115cc8;
    psVar29 = (secp256k1_context *)local_138;
    local_138._0_8_ = local_138._0_8_ * 2;
    local_138._8_8_ = local_138._8_8_ * 2;
    uStack_120 = uStack_120 * 2;
    local_138._16_8_ = local_138._16_8_ * 2;
    local_118 = local_118 << 1;
    local_110 = local_110 * 2;
    local_10c = 0;
    pcStack_1b0 = (code *)0x115b05;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    pcStack_1b0 = (code *)0x115b13;
    psStack_1c58 = psVar29;
    secp256k1_fe_mul((secp256k1_fe *)psVar29,(secp256k1_fe *)psVar29,d);
    r = (secp256k1_fe *)local_198;
    pcStack_1b0 = (code *)0x115b20;
    secp256k1_fe_verify(r);
    pcStack_1b0 = (code *)0x115b28;
    psVar28 = psVar29;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    uVar20 = (uint)psVar28;
    if (local_110 + local_170 < 0x21) {
      local_198._0_8_ = local_198._0_8_ + local_138._0_8_;
      local_198._8_8_ = local_198._8_8_ + local_138._8_8_;
      local_198._16_8_ = local_198._16_8_ + local_138._16_8_;
      uStack_180 = uStack_180 + uStack_120;
      local_178 = local_178 + local_118;
      local_16c = 0;
      pcStack_1b0 = (code *)0x115b79;
      local_170 = local_110 + local_170;
      secp256k1_fe_verify((secp256k1_fe *)local_198);
      if (known_on_curve == 0) {
        psVar16 = (secp256k1_fe *)&stack0xffffffffffffff68;
        pcStack_1b0 = (code *)0x115b95;
        secp256k1_fe_mul(psVar16,(secp256k1_fe *)local_198,d);
        goto LAB_00115bc6;
      }
      goto LAB_00115bd3;
    }
  }
  pcStack_1b0 = main;
  secp256k1_ecmult_const_xonly_cold_2();
  psStack_1d8 = (secp256k1_context *)r;
  psStack_1d0 = n;
  psStack_1c8 = psVar29;
  psStack_1c0 = d;
  psStack_1b8 = q;
  pcStack_1b0 = (code *)(ulong)(uint)known_on_curve;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < (int)uVar20) {
    lVar10 = strtol((char *)(psStack_1c58->ecmult_gen_ctx).ge_offset.x.n[0],(char **)0x0,0);
    count = (int)lVar10;
  }
  pcVar37 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < (int)uVar20) {
    pcVar37 = (char *)(psStack_1c58->ecmult_gen_ctx).ge_offset.x.n[1];
  }
  asStack_1660[0].ecmult_gen_ctx.built = 0;
  asStack_1660[0].ecmult_gen_ctx.scalar_offset = 0;
  asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  pFStack_1c68 = (FILE *)(ulong)uVar20;
  if ((pcVar37 == (char *)0x0) || (*pcVar37 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00117e32;
    sVar11 = fread(asStack_1660,1,0x10,__stream);
    if (sVar11 != 0x10) goto LAB_00117e32;
    goto LAB_00115e1c;
  }
  iVar5 = 0;
  while ((((iVar5 < 0x10 && (*pcVar37 != '\0')) && (pcVar37[1] != '\0')) &&
         (iVar6 = __isoc99_sscanf(pcVar37,"%2hx",auStack_990), iVar6 == 1))) {
    *(undefined1 *)((long)asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n + (long)iVar5 + -8) =
         auStack_990[0];
    pcVar37 = pcVar37 + 2;
    iVar5 = iVar5 + 1;
  }
LAB_00115e29:
  puStack_1c30 = (undefined1 *)((ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x38);
  uStack_1c38 = asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff;
  lVar10 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_1660[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
         (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
         (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
         (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
         (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
         (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,puStack_1c30,
         asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,uStack_1c38,
         asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
         asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
         asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
         asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
         asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
         asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
  auStack_990._0_8_ = 0xbb67ae856a09e667;
  auStack_990._8_8_ = 0xa54ff53a3c6ef372;
  auStack_990._16_8_ = 0x9b05688c510e527f;
  auStack_990._24_8_ = 0x5be0cd191f83d9ab;
  auStack_990._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_990,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_990,(uchar *)asStack_1660,0x10);
  puVar38 = auStack_ee0;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_990,puVar38);
  do {
    psVar16 = (secp256k1_fe *)0x0;
    uVar9 = 0;
    do {
      uVar9 = (ulong)puVar38[(long)psVar16] | uVar9 << 8;
      psVar16 = (secp256k1_fe *)((long)psVar16->n + 1);
    } while (psVar16 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar10] = uVar9;
    lVar10 = lVar10 + 1;
    puVar38 = puVar38 + 8;
  } while (lVar10 != 4);
  if (4 < (int)pFStack_1c68) {
    lVar10 = strtol((char *)(psStack_1c58->ecmult_gen_ctx).ge_offset.x.n[2],(char **)0x0,0);
    num_cores = (uint32_t)lVar10;
    uVar9 = strtol((char *)(psStack_1c58->ecmult_gen_ctx).ge_offset.x.n[3],(char **)0x0,0);
    this_core = (uint32_t)uVar9;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00117e58:
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar9 & 0xffffffff,(ulong)num_cores - 1)
    ;
  }
  psVar29 = (secp256k1_context *)0xd0;
  psVar12 = (secp256k1_ge *)malloc(0xd0);
  if (psVar12 != (secp256k1_ge *)0x0) {
    psVar29 = (secp256k1_context *)0x130;
    psVar13 = (secp256k1_gej *)malloc(0x130);
    if (psVar13 != (secp256k1_gej *)0x0) {
      psVar29 = (secp256k1_context *)0x130;
      psVar14 = (secp256k1_gej *)malloc(0x130);
      if (psVar14 != (secp256k1_gej *)0x0) {
        secp256k1_scalar_verify(&secp256k1_scalar_one);
        asStack_1660[0].ecmult_gen_ctx.built = 7;
        secp256k1_scalar_verify((secp256k1_scalar *)asStack_1660);
        secp256k1_gej_set_infinity((secp256k1_gej *)auStack_990);
        uVar20 = 0xff;
        do {
          secp256k1_gej_double_var
                    ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
          secp256k1_scalar_verify((secp256k1_scalar *)asStack_1660);
          bVar41 = (7U >> (uVar20 & 0x1f) & 1) != 0;
          psVar16 = (secp256k1_fe *)CONCAT71((int7)((ulong)psVar16 >> 8),bVar41);
          if ((uVar20 < 0x20) && (bVar41)) {
            psVar16 = (secp256k1_fe *)0x0;
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,
                       &secp256k1_ge_const_g,(secp256k1_fe *)0x0);
          }
          bVar41 = uVar20 != 0;
          uVar20 = uVar20 - 1;
        } while (bVar41);
        psVar29 = (secp256k1_context *)auStack_ee0;
        secp256k1_gej_double_var
                  ((secp256k1_gej *)psVar29,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0);
        iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar29,&secp256k1_ge_const_g);
        if (iVar5 != 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_ee0);
          lVar10 = -0x98;
          do {
            secp256k1_gej_add_var
                      ((secp256k1_gej *)auStack_ee0,(secp256k1_gej *)auStack_ee0,
                       (secp256k1_gej *)auStack_990,psVar16);
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0
                      );
            memcpy((void *)((long)psVar13[1].x.n + lVar10),(secp256k1_gej *)auStack_990,0x98);
            if (lVar10 != 0) {
              secp256k1_gej_double_var
                        ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,
                         (secp256k1_fe *)0x0);
            }
            lVar10 = lVar10 + 0x98;
          } while (lVar10 == 0);
          secp256k1_gej_neg(psVar14,(secp256k1_gej *)auStack_ee0);
          secp256k1_gej_add_var(psVar14 + 1,psVar14,psVar13,psVar16);
          secp256k1_ge_set_all_gej_var(psVar12,psVar14,len);
          r_00 = secp256k1_ecmult_gen_prec_table;
          lVar10 = 0;
          do {
            psVar29 = (secp256k1_context *)((long)(psVar12->x).n + lVar10);
            psVar28 = psVar29;
            secp256k1_ge_verify((secp256k1_ge *)psVar29);
            if (*(int *)((long)(&psVar12->y + 1) + lVar10) != 0) goto LAB_00117e6f;
            secp256k1_ge_to_storage(*r_00,(secp256k1_ge *)psVar29);
            lVar10 = lVar10 + 0x68;
            r_00 = (secp256k1_ge_storage (*) [2])((long)r_00 + 0x40);
          } while (lVar10 == 0x68);
          free(psVar14);
          free(psVar13);
          free(psVar12);
          secp256k1_gej_set_ge((secp256k1_gej *)auStack_990,&secp256k1_ge_const_g);
          secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_990,gen);
          iVar5 = 0x80;
          do {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_990,(secp256k1_gej *)auStack_990,(secp256k1_fe *)0x0
                      );
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_990,gen_00);
          iVar5 = count;
joined_r0x00116214:
          count = iVar5 + -1;
          if (iVar5 == 0) {
            testrand256((uchar *)asStack_1660);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,asStack_1660[0].ecmult_gen_ctx._0_8_ & 0xff,
                   (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
                   (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
                   (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
                   (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
                   (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
                   (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
                   (ulong)asStack_1660[0].ecmult_gen_ctx._0_8_ >> 0x38,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
                   asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
            puts("no problems found");
            return 0;
          }
          psStack_1c58 = secp256k1_context_create(1);
          testrand256(abStack_1980);
          psVar29 = psStack_1c58;
          iVar5 = secp256k1_context_randomize(psStack_1c58,abStack_1980);
          if (iVar5 == 0) goto LAB_00117ece;
          psStack_1c28 = psStack_1c58;
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_990);
          secp256k1_ge_set_gej((secp256k1_ge *)auStack_ee0,(secp256k1_gej *)auStack_990);
          iVar5 = 1;
          lVar10 = -0x4e0;
          psVar13 = (secp256k1_gej *)auStack_990;
          do {
            psVar14 = psVar13 + 1;
            secp256k1_gej_add_ge(psVar14,psVar13,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_998 + lVar10),psVar14);
            if (count != 0) {
              testutil_random_fe((secp256k1_fe *)asStack_1660);
              secp256k1_gej_rescale(psVar14,(secp256k1_fe *)asStack_1660);
            }
            auStack_1960._0_4_ = iVar5;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1960);
            secp256k1_ecmult_gen
                      (&psStack_1c58->ecmult_gen_ctx,(secp256k1_gej *)asStack_1660,
                       (secp256k1_scalar *)auStack_1960);
            psVar28 = (secp256k1_context *)auStack_11e0;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar28,(secp256k1_gej *)asStack_1660);
            if (*(int *)(auStack_990 + lVar10 + 0x58) != 0) goto LAB_00117e74;
            if (iStack_1180 != 0) goto LAB_00117e79;
            psVar28 = (secp256k1_context *)auStack_11e0;
            iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar28,
                                       (secp256k1_fe *)(auStack_998 + lVar10));
            if (iVar6 == 0) goto LAB_00117e7e;
            psVar28 = (secp256k1_context *)auStack_11b0;
            iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar28,
                                       (secp256k1_fe *)(auStack_990 + lVar10 + 0x28));
            if (iVar6 == 0) goto LAB_00117e83;
            iVar5 = iVar5 + 1;
            lVar10 = lVar10 + 0x68;
            psVar13 = psVar14;
          } while (lVar10 != 0);
          uVar9 = 0;
          puVar21 = auStack_ee0;
          lVar10 = 0;
          do {
            psVar28 = (secp256k1_context *)(puVar21 + (uVar9 / 0xd) * -0x548);
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)asStack_1660,(secp256k1_ge *)(auStack_ee0 + lVar10));
            iVar5 = secp256k1_ge_eq_var((secp256k1_ge *)psVar28,(secp256k1_ge *)asStack_1660);
            if (iVar5 == 0) goto LAB_00117e88;
            lVar10 = lVar10 + 0x68;
            puVar21 = puVar21 + 0x3a8;
            uVar9 = uVar9 + 9;
          } while (lVar10 != 0x548);
          psVar29 = (secp256k1_context *)auStack_ee0;
          secp256k1_ge_verify((secp256k1_ge *)psVar29);
          if (auStack_ee0._96_4_ == 0) goto LAB_00117ed3;
          psVar29 = (secp256k1_context *)auStack_990;
          secp256k1_gej_verify((secp256k1_gej *)psVar29);
          if (auStack_990._144_4_ == 0) goto LAB_00117ed8;
          lVar10 = 0xc;
          psVar29 = (secp256k1_context *)(auStack_ee0 + 0x68);
          psVar30 = (secp256k1_context *)(auStack_990 + 0x98);
          do {
            psVar28 = psVar29;
            secp256k1_ge_verify((secp256k1_ge *)psVar29);
            if ((psVar29->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00117e8d;
            psVar28 = psVar30;
            secp256k1_gej_verify((secp256k1_gej *)psVar30);
            if ((int)(psVar30->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00117e92;
            psVar30 = (secp256k1_context *)&(psVar30->ecmult_gen_ctx).proj_blind.magnitude;
            psVar29 = (secp256k1_context *)&(psVar29->ecmult_gen_ctx).ge_offset.infinity;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
          puStack_1c30 = auStack_ee0;
          uStack_1c60 = 0;
          puStack_1c50 = (undefined1 *)0x0;
          do {
            bVar41 = true;
            if ((ulong)num_cores != 1) {
              puStack_1c50 = (undefined1 *)((long)puStack_1c50 + 0xe7037ed1a0b428db);
              bVar41 = (uint32_t)
                       (((ulong)puStack_1c50 >> 0x20 ^ (ulong)puStack_1c50 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar41) {
              lVar10 = uStack_1c60 * 0x98;
              secp256k1_fe_inv((secp256k1_fe *)auStack_1960,
                               (secp256k1_fe *)(auStack_990 + lVar10 + 0x60));
              lVar34 = 0;
              puVar21 = puStack_1c30;
              uVar9 = uStack_1c60;
              do {
                psVar12 = (secp256k1_ge *)(puVar21 + (uVar9 / 0xd) * -0x548);
                psVar13 = (secp256k1_gej *)(auStack_990 + lVar34);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)asStack_1660,psVar13,
                           (secp256k1_gej *)(auStack_990 + lVar10),
                           (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
                iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1660,psVar12);
                if (iVar5 == 0) {
                  main_cold_55();
LAB_00117e49:
                  main_cold_54();
LAB_00117e4e:
                  main_cold_53();
LAB_00117e53:
                  main_cold_8();
                  goto LAB_00117e58;
                }
                if (uStack_1c60 != 0) {
                  secp256k1_gej_add_ge
                            ((secp256k1_gej *)asStack_1660,psVar13,
                             (secp256k1_ge *)(auStack_ee0 + uStack_1c60 * 0x68));
                  iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1660,psVar12);
                  if (iVar5 != 0) goto LAB_0011663f;
                  goto LAB_00117e53;
                }
LAB_0011663f:
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)asStack_1660,psVar13,
                           (secp256k1_ge *)(auStack_ee0 + uStack_1c60 * 0x68),(secp256k1_fe *)0x0);
                iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1660,psVar12);
                if (iVar5 == 0) goto LAB_00117e49;
                iStack_1180 = *(int *)(auStack_990 + lVar10 + 0x90);
                uStack_11c0 = *(uint64_t *)(auStack_990 + lVar10 + 0x20);
                uStack_11b8 = *(uint64_t *)(auStack_990 + lVar10 + 0x28);
                auStack_11d0._8_8_ = *(undefined8 *)(auStack_990 + lVar10 + 0x18);
                auStack_11d0._0_8_ = *(undefined8 *)(auStack_990 + lVar10 + 0x10);
                auStack_11e0._8_8_ = *(undefined8 *)(auStack_990 + lVar10 + 8);
                auStack_11e0._0_8_ = (((secp256k1_gej *)(auStack_990 + lVar10))->x).n[0];
                auStack_11b0._0_8_ = *(undefined8 *)(auStack_990 + lVar10 + 0x30);
                auStack_11b0._8_8_ = *(undefined8 *)(auStack_990 + lVar10 + 0x38);
                auStack_11b0._16_16_ = *(undefined1 (*) [16])(auStack_990 + lVar10 + 0x40);
                uStack_1190 = *(uint64_t *)(auStack_990 + lVar10 + 0x50);
                uStack_1188 = *(uint64_t *)(auStack_990 + lVar10 + 0x58);
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)asStack_1660,psVar13,(secp256k1_ge *)auStack_11e0,
                           (secp256k1_fe *)auStack_1960);
                iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1660,psVar12);
                if (iVar5 == 0) goto LAB_00117e4e;
                lVar34 = lVar34 + 0x98;
                puVar21 = puVar21 + 0x68;
                uVar9 = uVar9 + 1;
              } while (lVar34 != 0x7b8);
            }
            uStack_1c60 = uStack_1c60 + 1;
            puStack_1c30 = puStack_1c30 + 0x68;
          } while (uStack_1c60 != 0xd);
          uVar9 = 0;
          puVar21 = auStack_ee0;
          lVar10 = 0;
          do {
            secp256k1_gej_double
                      ((secp256k1_gej *)asStack_1660,(secp256k1_gej *)(auStack_990 + lVar10));
            psVar28 = asStack_1660;
            iVar5 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)asStack_1660,
                               (secp256k1_ge *)(puVar21 + (uVar9 / 0xd) * -0x548));
            if (iVar5 == 0) goto LAB_00117e9c;
            secp256k1_gej_double_var
                      ((secp256k1_gej *)asStack_1660,(secp256k1_gej *)(auStack_990 + lVar10),
                       (secp256k1_fe *)0x0);
            psVar28 = asStack_1660;
            iVar5 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)asStack_1660,
                               (secp256k1_ge *)(puVar21 + (uVar9 / 0xd) * -0x548));
            if (iVar5 == 0) goto LAB_00117ea1;
            lVar10 = lVar10 + 0x98;
            puVar21 = puVar21 + 0xd0;
            uVar9 = uVar9 + 2;
          } while (lVar10 != 0x7b8);
          lVar10 = 0x68;
          psVar12 = &sStack_a00;
          psVar13 = (secp256k1_gej *)(auStack_990 + 0x98);
          do {
            psVar28 = (secp256k1_context *)auStack_11e0;
            secp256k1_ge_neg((secp256k1_ge *)psVar28,(secp256k1_ge *)(auStack_ee0 + lVar10));
            iVar5 = secp256k1_ge_eq_var((secp256k1_ge *)psVar28,psVar12);
            if (iVar5 == 0) goto LAB_00117ea6;
            secp256k1_gej_neg((secp256k1_gej *)asStack_1660,psVar13);
            psVar28 = asStack_1660;
            iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1660,psVar12);
            if (iVar5 == 0) goto LAB_00117eab;
            lVar10 = lVar10 + 0x68;
            psVar13 = psVar13 + 1;
            psVar12 = psVar12 + -1;
          } while (lVar10 != 0x548);
          puVar21 = (undefined1 *)0x1;
          uStack_1c48 = 0x68;
          uStack_1c38 = 0;
LAB_00116860:
          lVar10 = (long)puVar21 * 0x98;
          pFStack_1c68 = (FILE *)0x0;
          puStack_1c50 = auStack_ee0;
          puStack_1c30 = puVar21;
          while( true ) {
            bVar41 = true;
            if ((ulong)num_cores != 1) {
              uStack_1c38 = uStack_1c38 + 0xe7037ed1a0b428db;
              bVar41 = (uint32_t)
                       ((uStack_1c38 >> 0x20 ^ uStack_1c38 & 0xffffffff) * (ulong)num_cores >> 0x20)
                       == this_core;
            }
            if (bVar41) break;
LAB_001169b3:
            pFStack_1c68 = (FILE *)((long)&pFStack_1c68->_flags + 1);
            puStack_1c50 = puStack_1c50 + 0x68;
            if ((int)pFStack_1c68 == 0xd) goto code_r0x001169cf;
          }
          iVar5 = 0;
          puVar35 = puStack_1c50;
          __stream = pFStack_1c68;
          while( true ) {
            auStack_1b70._0_4_ = iVar5;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b70);
            auStack_1c20._0_4_ = (int)pFStack_1c68;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c20);
            auStack_1bf0._8_8_ = auStack_11e0;
            auStack_1bf0._0_8_ = auStack_1960;
            auStack_1be0._0_8_ = asStack_1660;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1bf0,(secp256k1_gej *)&sStack_1b00,1,
                       (secp256k1_gej *)(auStack_990 + lVar10),(secp256k1_scalar *)auStack_1b70,
                       (secp256k1_scalar *)auStack_1c20);
            iVar6 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)&sStack_1b00,
                               (secp256k1_ge *)(puVar35 + ((ulong)__stream / 0xd) * -0x548));
            if (iVar6 == 0) break;
            iVar5 = iVar5 + 1;
            puVar35 = puVar35 + uStack_1c48;
            __stream = (FILE *)(puStack_1c30 + (long)&__stream->_flags);
            puVar21 = puStack_1c30;
            if (iVar5 == 0xd) goto LAB_001169b3;
          }
          main_cold_48();
LAB_00117e32:
          main_cold_1();
LAB_00115e1c:
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          goto LAB_00115e29;
        }
        goto LAB_00117ec9;
      }
      goto LAB_00117ee7;
    }
    goto LAB_00117ee2;
  }
LAB_00117edd:
  main_cold_65();
LAB_00117ee2:
  main_cold_64();
LAB_00117ee7:
  main_cold_63();
LAB_00117eec:
  main_cold_10();
LAB_00117ef1:
  main_cold_11();
LAB_00117ef6:
  main_cold_12();
LAB_00117efb:
  main_cold_13();
LAB_00117f00:
  main_cold_9();
LAB_00117f05:
  main_cold_40();
LAB_00117f0a:
  main_cold_39();
LAB_00117f0f:
  main_cold_38();
LAB_00117f14:
  main_cold_37();
LAB_00117f19:
  main_cold_36();
LAB_00117f1e:
  main_cold_35();
LAB_00117f23:
  main_cold_14();
LAB_00117f28:
  main_cold_34();
LAB_00117f2d:
  main_cold_15();
LAB_00117f32:
  main_cold_33();
LAB_00117f37:
  main_cold_16();
LAB_00117f3c:
  main_cold_32();
LAB_00117f41:
  main_cold_31();
LAB_00117f46:
  main_cold_17();
LAB_00117f4b:
  main_cold_18();
LAB_00117f50:
  main_cold_19();
LAB_00117f55:
  main_cold_20();
LAB_00117f5a:
  main_cold_30();
LAB_00117f5f:
  main_cold_29();
LAB_00117f64:
  main_cold_28();
LAB_00117f69:
  main_cold_27();
LAB_00117f6e:
  main_cold_21();
LAB_00117f73:
  main_cold_22();
LAB_00117f78:
  main_cold_23();
LAB_00117f7d:
  main_cold_24();
LAB_00117f82:
  main_cold_26();
LAB_00117f87:
  main_cold_25();
  lVar10 = 0;
  do {
    uVar32 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar31 = secp256k1_test_state[1] << 0x11;
    uVar19 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar9 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar19;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar9;
    secp256k1_test_state[3] = uVar9 << 0x2d | uVar9 >> 0x13;
    secp256k1_test_state[2] = uVar19 ^ uVar31;
    (psVar29->ecmult_gen_ctx).ge_offset.x.n[lVar10 + -1] = uVar32;
    lVar10 = lVar10 + 1;
  } while ((int)lVar10 != 4);
  return (int)secp256k1_test_state[0];
code_r0x001169cf:
  puVar21 = puVar21 + 1;
  uStack_1c48 = uStack_1c48 + 0x68;
  if (puVar21 == (undefined1 *)0xd) goto code_r0x001169e2;
  goto LAB_00116860;
code_r0x001169e2:
  lVar10 = 0;
  do {
    lVar34 = 0;
    do {
      bVar41 = true;
      if ((ulong)num_cores != 1) {
        uStack_1c38 = uStack_1c38 + 0xe7037ed1a0b428db;
        bVar41 = (uint32_t)
                 ((uStack_1c38 >> 0x20 ^ uStack_1c38 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar41) {
        auStack_1bf0._0_4_ = (int)lVar10;
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
        a = (secp256k1_ge *)(auStack_ee0 + lVar34 * 0x68);
        secp256k1_ecmult_const((secp256k1_gej *)asStack_1660,a,(secp256k1_scalar *)auStack_1bf0);
        uVar20 = (int)lVar34 * (int)lVar10;
        psVar12 = (secp256k1_ge *)
                  (auStack_ee0 + (ulong)(uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc)) * 0x68);
        psVar28 = asStack_1660;
        iVar5 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1660,psVar12);
        if (iVar5 == 0) goto LAB_00117eb0;
        if (lVar34 != 0 && lVar10 != 0) {
          psVar30 = (secp256k1_context *)&sStack_1b00;
          psVar28 = psVar30;
          iVar5 = secp256k1_ecmult_const_xonly
                            ((secp256k1_fe *)psVar30,(secp256k1_fe *)a,(secp256k1_fe *)0x0,
                             (secp256k1_scalar *)auStack_1bf0,0);
          if (iVar5 == 0) goto LAB_00117eb5;
          iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar30,(secp256k1_fe *)psVar12);
          if (iVar5 == 0) goto LAB_00117eba;
          do {
            psVar28 = (secp256k1_context *)auStack_1960;
            testutil_random_fe((secp256k1_fe *)psVar28);
            secp256k1_fe_verify((secp256k1_fe *)psVar28);
            if (iStack_1934 == 0) {
              main_cold_44();
              goto LAB_00117e6f;
            }
          } while ((SUB168(auStack_1950 | auStack_1960,8) == 0 &&
                   SUB168(auStack_1950 | auStack_1960,0) == 0) && uStack_1940 == 0);
          secp256k1_fe_mul((secp256k1_fe *)auStack_11e0,(secp256k1_fe *)auStack_1960,
                           (secp256k1_fe *)a);
          psVar29 = (secp256k1_context *)&sStack_1b00;
          psVar30 = psVar29;
          iVar5 = secp256k1_ecmult_const_xonly
                            ((secp256k1_fe *)psVar29,(secp256k1_fe *)auStack_11e0,
                             (secp256k1_fe *)auStack_1960,(secp256k1_scalar *)auStack_1bf0,0);
          if (iVar5 == 0) goto LAB_00117ebf;
          iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar29,(secp256k1_fe *)psVar12);
          if (iVar5 == 0) goto LAB_00117ec4;
        }
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != 0xd);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0xd);
  scratch = (secp256k1_scratch *)malloc(0x1020);
  if (scratch == (secp256k1_scratch *)0x0) {
    (*(psStack_1c58->error_callback).fn)("Out of memory",(psStack_1c58->error_callback).data);
  }
  else {
    scratch->magic[0] = '\0';
    scratch->magic[1] = '\0';
    scratch->magic[2] = '\0';
    scratch->magic[3] = '\0';
    scratch->magic[4] = '\0';
    scratch->magic[5] = '\0';
    scratch->magic[6] = '\0';
    scratch->magic[7] = '\0';
    scratch->data = (void *)0x0;
    scratch->alloc_size = 0;
    scratch->max_size = 0;
    builtin_memcpy(scratch->magic,"scratch",8);
    scratch->data = scratch + 1;
    scratch->max_size = 0x1000;
  }
  psStack_1c28 = (secp256k1_context *)&psStack_1c28->error_callback;
  uStack_1b18 = 0;
  uStack_1c60 = 0;
  p_Stack_1b10 = (_func_void_char_ptr_void_ptr *)0x0;
  do {
    uStack_1c38 = 0;
    lVar10 = 0;
    do {
      puVar21 = auStack_ee0;
      puVar35 = (undefined1 *)0x0;
      do {
        auStack_1bb0._32_8_ = 0;
        puStack_1c30 = puVar35;
        auStack_1bb0._40_8_ = puVar21;
        auStack_1bb0._48_8_ = puVar35;
        puStack_1b08 = puVar21;
        do {
          bVar41 = true;
          if ((ulong)num_cores != 1) {
            p_Stack_1b10 = p_Stack_1b10 + -0x18fc812e5f4bd725;
            bVar41 = (uint32_t)
                     (((ulong)p_Stack_1b10 >> 0x20 ^ (ulong)p_Stack_1b10 & 0xffffffff) *
                      (ulong)num_cores >> 0x20) == this_core;
          }
          if (bVar41) {
            lVar34 = auStack_1bb0._32_8_ * 0x68;
            lVar23 = 0;
            puVar21 = (undefined1 *)auStack_1bb0._40_8_;
            puVar39 = (undefined1 *)auStack_1bb0._48_8_;
            do {
              asStack_1660[0].ecmult_gen_ctx.built = (int)uStack_1c60;
              secp256k1_scalar_verify((secp256k1_scalar *)asStack_1660);
              asStack_1660[0].ecmult_gen_ctx.scalar_offset = (int)lVar10;
              secp256k1_scalar_verify(&asStack_1660[0].ecmult_gen_ctx.scalar_offset);
              auStack_1960._0_4_ = (int)puVar35;
              secp256k1_scalar_verify((secp256k1_scalar *)auStack_1960);
              puVar25 = (uint64_t *)(auStack_ee0 + lVar34);
              psVar12 = &asStack_1660[0].ecmult_gen_ctx.ge_offset;
              for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
                (psVar12->x).n[0] = *puVar25;
                puVar25 = puVar25 + (ulong)bVar42 * -2 + 1;
                psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar42 * -2 + 1) * 8);
              }
              puVar25 = (uint64_t *)(auStack_ee0 + lVar23);
              psVar16 = &asStack_1660[0].ecmult_gen_ctx.proj_blind;
              for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
                psVar16->n[0] = *puVar25;
                puVar25 = puVar25 + (ulong)bVar42 * -2 + 1;
                psVar16 = (secp256k1_fe *)((long)psVar16 + ((ulong)bVar42 * -2 + 1) * 8);
              }
              psVar28 = (secp256k1_context *)auStack_11e0;
              secp256k1_ecmult_multi_var
                        ((secp256k1_callback *)psStack_1c28,scratch,(secp256k1_gej *)psVar28,
                         (secp256k1_scalar *)auStack_1960,ecmult_multi_callback,asStack_1660,2);
              iVar5 = secp256k1_gej_eq_ge_var
                                ((secp256k1_gej *)psVar28,
                                 (secp256k1_ge *)(puVar21 + ((ulong)puVar39 / 0xd) * -0x548));
              if (iVar5 == 0) goto LAB_00117e97;
              lVar23 = lVar23 + 0x68;
              puVar21 = puVar21 + uStack_1c38;
              puVar39 = puVar39 + lVar10;
              puVar35 = puStack_1c30;
            } while (lVar23 != 0x548);
          }
          auStack_1bb0._32_8_ = auStack_1bb0._32_8_ + 1;
          auStack_1bb0._40_8_ = auStack_1bb0._40_8_ + uStack_1b18;
          auStack_1bb0._48_8_ = auStack_1bb0._48_8_ + uStack_1c60;
        } while (auStack_1bb0._32_8_ != 0xd);
        puVar35 = puVar35 + 1;
        puVar21 = puStack_1b08 + 0x68;
      } while (puVar35 != (undefined1 *)0xd);
      lVar10 = lVar10 + 1;
      uStack_1c38 = uStack_1c38 + 0x68;
    } while (lVar10 != 0xd);
    uStack_1c60 = uStack_1c60 + 1;
    uStack_1b18 = uStack_1b18 + 0x68;
  } while (uStack_1c60 != 0xd);
  puVar38 = (uchar *)0x0;
  if (scratch != (secp256k1_scratch *)0x0) {
    puVar38 = (uchar *)0x0;
    do {
      puVar35 = (undefined1 *)((ulong)puVar21 & 0xffffffff);
      bVar2 = puVar38[(long)scratch->magic];
      bVar3 = puVar38[0x123f91];
      psVar29 = (secp256k1_context *)(ulong)bVar3;
      puVar21 = (undefined1 *)(ulong)((uint)bVar2 - (uint)bVar3);
      if (bVar2 == bVar3) {
        puVar21 = puVar35;
      }
      iVar5 = (int)puVar21;
      if (bVar2 != bVar3) goto LAB_00116ede;
      puVar38 = puVar38 + 1;
    } while (puVar38 != (uchar *)0x8);
    iVar5 = 0;
LAB_00116ede:
    if (iVar5 == 0) {
      if (scratch->alloc_size != 0) goto LAB_00117f00;
      scratch->magic[0] = '\0';
      scratch->magic[1] = '\0';
      scratch->magic[2] = '\0';
      scratch->magic[3] = '\0';
      scratch->magic[4] = '\0';
      scratch->magic[5] = '\0';
      scratch->magic[6] = '\0';
      scratch->magic[7] = '\0';
      free(scratch);
    }
    else {
      (*(psStack_1c58->error_callback).fn)
                ("invalid scratch space",(psStack_1c58->error_callback).data);
    }
  }
  iVar5 = 1;
  pFStack_1c68 = (FILE *)0x0;
  do {
    iVar6 = 1;
    do {
      puVar38 = (uchar *)CONCAT71((int7)((ulong)puVar38 >> 8),1);
      if ((ulong)num_cores != 1) {
        pFStack_1c68 = (FILE *)((long)pFStack_1c68 + 0xe7037ed1a0b428db);
        puVar38 = (uchar *)CONCAT71((int7)(((ulong)pFStack_1c68 & 0xffffffff) >> 8),
                                    (uint32_t)
                                    (((ulong)pFStack_1c68 >> 0x20 ^ (ulong)pFStack_1c68 & 0xffffffff
                                     ) * (ulong)num_cores >> 0x20) == this_core);
      }
      if ((char)puVar38 != '\0') {
        sStack_1b00.fn._0_4_ = 1;
        iVar22 = 1;
        do {
          auStack_1b70._0_4_ = iVar5;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b70);
          auStack_1bf0._0_4_ = iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
          auStack_11e0 = (undefined1  [16])0x0;
          auStack_11d0._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_11d0[0xf] = (char)iVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b70);
          auStack_1960 = (undefined1  [16])0x0;
          auStack_1950._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1950[0xf] = (char)iVar5;
          overflow = (int *)auStack_11e0;
          psVar29 = psStack_1c58;
          iVar7 = secp256k1_ecdsa_sign
                            (psStack_1c58,(secp256k1_ecdsa_signature *)asStack_1660,auStack_1960,
                             (uchar *)overflow,secp256k1_nonce_function_smallint,&sStack_1b00);
          if (iVar7 != 1) goto LAB_00117eec;
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1c20,(uchar *)asStack_1660,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1b40,
                     (uchar *)(asStack_1660[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          psVar29 = (secp256k1_context *)auStack_1bb0;
          r_from_k((secp256k1_scalar *)psVar29,(secp256k1_ge *)auStack_ee0,(int)sStack_1b00.fn,
                   overflow);
          if (auStack_1c20._0_4_ != auStack_1bb0._0_4_) goto LAB_00117ef1;
          iVar7 = (int)sStack_1b00.fn;
          uVar24 = auStack_1b40._0_4_ * (int)sStack_1b00.fn;
          uVar20 = auStack_1c20._0_4_ * iVar6 + iVar5;
          uVar20 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
          puVar38 = (uchar *)(ulong)uVar20;
          if (uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc) != uVar20) {
            uVar24 = (0xd - auStack_1b40._0_4_) * (int)sStack_1b00.fn;
            psVar29 = (secp256k1_context *)(ulong)((uVar24 / 0xd) * 3);
            if (uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc) != uVar20) goto LAB_00117ef6;
          }
          if ((int)sStack_1b00.fn < iVar22) break;
          iVar22 = (int)sStack_1b00.fn + 1;
          sStack_1b00.fn._0_4_ = iVar22;
        } while (iVar7 < 0xc);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xd);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0xd);
  uStack_1c60._0_4_ = 1;
  uStack_1c48 = 0;
  do {
    iVar5 = 1;
    do {
      iVar6 = 1;
      do {
        puVar21 = (undefined1 *)0x1;
        do {
          puVar38 = (uchar *)CONCAT71((int7)((ulong)puVar38 >> 8),1);
          if ((ulong)num_cores != 1) {
            uStack_1c48 = uStack_1c48 + 0xe7037ed1a0b428db;
            puVar38 = (uchar *)CONCAT71((int7)((uStack_1c48 & 0xffffffff) >> 8),
                                        (uint32_t)
                                        ((uStack_1c48 >> 0x20 ^ uStack_1c48 & 0xffffffff) *
                                         (ulong)num_cores >> 0x20) == this_core);
          }
          if ((char)puVar38 != '\0') {
            auStack_1b40._0_4_ = (uint)uStack_1c60;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b40);
            auStack_1c20._0_4_ = iVar5;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c20);
            auStack_1b70._0_4_ = iVar6;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b70);
            auStack_1bf0._0_4_ = (int)puVar21;
            puStack_1c30 = puVar21;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
            uVar20 = 0;
            iVar22 = 0;
            do {
              r_from_k((secp256k1_scalar *)asStack_1660,(secp256k1_ge *)auStack_ee0,iVar22,
                       (int *)puVar38);
              if (iVar5 == asStack_1660[0].ecmult_gen_ctx.built) {
                auStack_1bb0._0_4_ = iVar22;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bb0);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1bb0,(secp256k1_scalar *)auStack_1bb0,
                           (secp256k1_scalar *)auStack_1b40);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1c3c,(secp256k1_scalar *)auStack_1c20,
                           (secp256k1_scalar *)auStack_1bf0);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1c3c,(secp256k1_scalar *)auStack_1c3c,
                           (secp256k1_scalar *)auStack_1b70);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bb0);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c3c);
                puVar38 = (uchar *)(ulong)((uchar  [4])auStack_1bb0._0_4_ == auStack_1c3c);
                uVar20 = uVar20 | (uchar  [4])auStack_1bb0._0_4_ == auStack_1c3c;
              }
              iVar22 = iVar22 + 1;
            } while (iVar22 != 0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b40);
            secp256k1_ecdsa_signature_save
                      ((secp256k1_ecdsa_signature *)auStack_11e0,(secp256k1_scalar *)auStack_1c20,
                       (secp256k1_scalar *)auStack_1b40);
            puVar21 = puStack_1c30;
            puVar26 = (undefined8 *)(auStack_ee0 + (long)puStack_1c30 * 0x68);
            psVar29 = asStack_1660;
            for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
              uVar1 = *puVar26;
              (psVar29->ecmult_gen_ctx).built = (int)uVar1;
              (psVar29->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar1 >> 0x20);
              puVar26 = puVar26 + (ulong)bVar42 * -2 + 1;
              psVar29 = (secp256k1_context *)((long)psVar29 + (ulong)bVar42 * -0x10 + 8);
            }
            puVar38 = auStack_1960;
            secp256k1_ge_to_bytes(puVar38,(secp256k1_ge *)asStack_1660);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b70);
            sStack_1b00.fn = (_func_void_char_ptr_void_ptr *)0x0;
            sStack_1b00.data = (void *)0x0;
            auStack_1af0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1af0[0xf] = (char)iVar6;
            psVar29 = psStack_1c58;
            uVar24 = secp256k1_ecdsa_verify
                               (psStack_1c58,(secp256k1_ecdsa_signature *)auStack_11e0,
                                (uchar *)&sStack_1b00,(secp256k1_pubkey *)puVar38);
            if (((uint)uStack_1c60 < 7 & uVar20) != uVar24) goto LAB_00117efb;
          }
          puVar21 = puVar21 + 1;
        } while (puVar21 != (undefined1 *)0xd);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xd);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0xd);
    uStack_1c60._0_4_ = (uint)uStack_1c60 + 1;
  } while ((uint)uStack_1c60 != 0xd);
  pFStack_1c68 = (FILE *)0x1;
  puVar21 = auStack_19a0;
  puVar35 = (undefined1 *)&sStack_1b00;
  do {
    auStack_1b40._0_4_ = (int)pFStack_1c68;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b40);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b40);
    auStack_1c20 = (undefined1  [16])0x0;
    auStack_1c10._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1c10[0xf] = (char)pFStack_1c68;
    lVar10 = (long)pFStack_1c68 - 1;
    keypair = (secp256k1_keypair *)
              ((long)(&asStack_1660[0].ecmult_gen_ctx.ge_offset + -1) + (long)pFStack_1c68 * 0x60);
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_keypair_create(psStack_1c58,keypair,auStack_1c20);
    if (iVar5 == 0) goto LAB_00117f05;
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_ec_pubkey_create
                      (psStack_1c58,(secp256k1_pubkey *)(auStack_11e0 + lVar10 * 0x40),auStack_1c20)
    ;
    if (iVar5 == 0) goto LAB_00117f0a;
    psVar40 = (secp256k1_xonly_pubkey *)(auStack_1960 + lVar10 * 0x40);
    pk_parity = (uchar (*) [4])(auStack_1bf0 + lVar10 * 4);
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_keypair_xonly_pub(psStack_1c58,psVar40,(int *)pk_parity,keypair);
    if (iVar5 == 0) goto LAB_00117f0f;
    puVar38 = (uchar *)((long)&sStack_1b00 + lVar10 * 0x20);
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_xonly_pubkey_serialize(psStack_1c58,puVar38,psVar40);
    if (iVar5 == 0) goto LAB_00117f14;
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_xonly_pubkey_parse(psStack_1c58,psVar40,puVar38);
    if (iVar5 == 0) goto LAB_00117f19;
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_xonly_pubkey_serialize(psStack_1c58,auStack_1c20,psVar40);
    if (iVar5 == 0) goto LAB_00117f1e;
    lVar34 = 0;
    do {
      bVar2 = auStack_1c20[lVar34];
      psVar29 = (secp256k1_context *)(ulong)bVar2;
      iVar5 = (uint)(byte)puVar35[lVar34] - (uint)bVar2;
      if (puVar35[lVar34] != bVar2) goto LAB_001174f2;
      lVar34 = lVar34 + 1;
    } while (lVar34 != 0x20);
    iVar5 = 0;
LAB_001174f2:
    if (iVar5 != 0) goto LAB_00117f23;
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_xonly_pubkey_from_pubkey
                      (psStack_1c58,psVar40,(int *)auStack_1bb0,
                       (secp256k1_pubkey *)(auStack_11e0 + lVar10 * 0x40));
    if (iVar5 == 0) goto LAB_00117f28;
    if ((uchar  [4])auStack_1bb0._0_4_ != *pk_parity) goto LAB_00117f2d;
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_xonly_pubkey_serialize(psStack_1c58,auStack_1c20,psVar40);
    if (iVar5 == 0) goto LAB_00117f32;
    lVar10 = 0;
    do {
      bVar2 = auStack_1c20[lVar10];
      psVar29 = (secp256k1_context *)(ulong)bVar2;
      iVar5 = (uint)(byte)puVar35[lVar10] - (uint)bVar2;
      if (puVar35[lVar10] != bVar2) goto LAB_0011756d;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    iVar5 = 0;
LAB_0011756d:
    if (iVar5 != 0) goto LAB_00117f37;
    psVar29 = (secp256k1_context *)auStack_1b70;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar29,puVar38);
    auStack_1b70._40_8_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    lVar10 = (long)pFStack_1c68 * 0x68;
    iVar5 = secp256k1_fe_equal((secp256k1_fe *)psVar29,(secp256k1_fe *)(auStack_ee0 + lVar10));
    if (iVar5 == 0) goto LAB_00117f3c;
    auStack_1b70._0_8_ = *(undefined8 *)(auStack_ee0 + lVar10 + 0x30);
    auStack_1b70._8_8_ = *(undefined8 *)(auStack_ee0 + lVar10 + 0x38);
    auStack_1b70._16_8_ = *(undefined8 *)(auStack_ee0 + lVar10 + 0x40);
    auStack_1b70._24_8_ = *(undefined8 *)(auStack_ee0 + lVar10 + 0x48);
    auStack_1b70._32_8_ = *(undefined8 *)(auStack_ee0 + lVar10 + 0x50);
    auStack_1b70._40_8_ = *(undefined8 *)(auStack_ee0 + lVar10 + 0x58);
    psVar29 = (secp256k1_context *)auStack_1b70;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar29);
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    if (auStack_1b70._44_4_ == 0) goto LAB_00117f41;
    if ((uchar  [4])(auStack_1b70._0_4_ & 1) != *pk_parity) goto LAB_00117f46;
    if (6 < pFStack_1c68) {
      lVar10 = 0;
      psVar28 = extraout_RDX;
      do {
        psVar29 = (secp256k1_context *)((ulong)psVar28 & 0xffffffff);
        bVar2 = puVar35[lVar10];
        bVar3 = puVar21[lVar10];
        psVar28 = (secp256k1_context *)(ulong)((uint)bVar2 - (uint)bVar3);
        if (bVar2 == bVar3) {
          psVar28 = psVar29;
        }
        iVar5 = (int)psVar28;
        if (bVar2 != bVar3) goto LAB_00117664;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      iVar5 = 0;
LAB_00117664:
      if (iVar5 != 0) goto LAB_00117f4b;
      if (*pk_parity != (uchar  [4])(1U - *(int *)(auStack_1bf0 + (0xc - (long)pFStack_1c68) * 4)))
      goto LAB_00117f50;
    }
    pFStack_1c68 = (FILE *)((long)pFStack_1c68 + 1);
    puVar35 = puVar35 + 0x20;
    puVar21 = puVar21 + -0x20;
  } while (pFStack_1c68 != (FILE *)0xd);
  lVar10 = 0;
  do {
    psVar29 = psStack_1c58;
    iVar5 = secp256k1_xonly_pubkey_parse
                      (psStack_1c58,(secp256k1_xonly_pubkey *)asStack_1660,
                       invalid_pubkey_bytes[0] + lVar10);
    if (iVar5 != 0) goto LAB_00117f55;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0xe0);
  iVar5 = 1;
  psVar28 = asStack_1660;
  psVar40 = (secp256k1_xonly_pubkey *)auStack_11e0;
  puVar38 = auStack_1960;
  lVar10 = 0;
  do {
    auStack_1bf0._0_4_ = iVar5;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
    sStack_1b00.fn = (_func_void_char_ptr_void_ptr *)0x0;
    sStack_1b00.data = (void *)0x0;
    auStack_1af0._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1af0[0xf] = (char)iVar5;
    psVar29 = psStack_1c58;
    iVar6 = secp256k1_keypair_create
                      (psStack_1c58,(secp256k1_keypair *)psVar28,(uchar *)&sStack_1b00);
    if (iVar6 == 0) goto LAB_00117f5a;
    psVar29 = psStack_1c58;
    iVar6 = secp256k1_keypair_xonly_pub
                      (psStack_1c58,psVar40,(int *)(auStack_1b70 + lVar10),
                       (secp256k1_keypair *)psVar28);
    if (iVar6 == 0) goto LAB_00117f5f;
    psVar29 = psStack_1c58;
    iVar6 = secp256k1_xonly_pubkey_serialize(psStack_1c58,puVar38,psVar40);
    if (iVar6 == 0) goto LAB_00117f64;
    lVar10 = lVar10 + 4;
    puVar38 = puVar38 + 0x20;
    psVar40 = psVar40 + 1;
    psVar28 = (secp256k1_context *)&(psVar28->ecmult_gen_ctx).ge_offset.y.magnitude;
    iVar5 = iVar5 + 1;
  } while (lVar10 != 0x30);
  auStack_1bb0._16_8_ = (uchar *)0x0;
  auStack_1bb0._0_8_ = 0x8cb36fda;
  auStack_1bb0._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  uStack_1c48 = 1;
  uVar9 = 0;
  do {
    iVar5 = 0xd - (int)uStack_1c48;
    if ((&uStack_1b74)[uStack_1c48] == 0) {
      iVar5 = (int)uStack_1c48;
    }
    auStack_1c3c[0] = '\x01';
    auStack_1c3c[1] = '\0';
    auStack_1c3c[2] = '\0';
    auStack_1c3c[3] = '\0';
    do {
      auStack_1bd0 = (undefined1  [16])0x0;
      auStack_1be0 = (undefined1  [16])0x0;
      auStack_1bf0 = (undefined1  [16])0x0;
      uStack_1bc0 = 0;
      bVar41 = true;
      if ((ulong)num_cores != 1) {
        uVar9 = uVar9 + 0xe7037ed1a0b428db;
        bVar41 = (uint32_t)((uVar9 >> 0x20 ^ uVar9 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar41) {
        auStack_1bb0._8_8_ = secp256k1_hardened_nonce_function_smallint;
        auStack_1bb0._16_8_ = auStack_1c3c;
        auVar4 = (uchar  [4])(0xd - (int)auStack_1c3c);
        if ((&uStack_1b74)[(int)auStack_1c3c] == 0) {
          auVar4 = auStack_1c3c;
        }
        iVar6 = 0;
        do {
          testrand256(auStack_1c20);
          secp256k1_schnorrsig_challenge
                    (&uStack_1b74,abStack_1980 + (long)(int)auStack_1c3c * 0x20,auStack_1c20,0x20,
                     auStack_1960 + (uStack_1c48 + -1) * 0x20);
          uVar19 = (ulong)uStack_1b74;
          if (*(int *)(auStack_1bf0 + uVar19 * 4) == 0) {
            uVar20 = uStack_1b74 * iVar5 + (int)auVar4;
            sVar33 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
            sStack_1b78 = sVar33;
            secp256k1_scalar_verify(&sStack_1b78);
            auStack_1b40 = (undefined1  [16])0x0;
            auStack_1b30._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1b30[0xf] = (char)sVar33;
            psVar29 = psStack_1c58;
            iVar22 = secp256k1_schnorrsig_sign_custom
                               (psStack_1c58,(uchar *)&sStack_1b00,auStack_1c20,0x20,
                                (secp256k1_keypair *)
                                ((long)(&asStack_1660[0].ecmult_gen_ctx.ge_offset + -1) +
                                uStack_1c48 * 0x60),(secp256k1_schnorrsig_extraparams *)auStack_1bb0
                               );
            if (iVar22 == 0) goto LAB_00117f69;
            pbVar18 = abStack_1980;
            pbVar15 = pbVar18 + (long)(int)auStack_1c3c * 0x20;
            lVar10 = 0;
            do {
              pbVar27 = (byte *)((ulong)pbVar18 & 0xffffffff);
              bVar2 = *(byte *)((long)&sStack_1b00 + lVar10);
              psVar29 = (secp256k1_context *)(ulong)bVar2;
              bVar3 = pbVar15[lVar10];
              pbVar18 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar18 = pbVar27;
              }
              iVar22 = (int)pbVar18;
              if (bVar2 != bVar3) goto LAB_001179cf;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x20);
            iVar22 = 0;
LAB_001179cf:
            if (iVar22 != 0) goto LAB_00117f6e;
            lVar10 = 0;
            do {
              pbVar18 = (byte *)((ulong)pbVar15 & 0xffffffff);
              bVar2 = auStack_1ae0[lVar10];
              bVar3 = auStack_1b40[lVar10];
              psVar29 = (secp256k1_context *)(ulong)bVar3;
              pbVar15 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar15 = pbVar18;
              }
              iVar22 = (int)pbVar15;
              if (bVar2 != bVar3) goto LAB_00117a02;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x20);
            iVar22 = 0;
LAB_00117a02:
            if (iVar22 != 0) goto LAB_00117f73;
            *(undefined4 *)(auStack_1bf0 + uVar19 * 4) = 1;
            iVar6 = iVar6 + 1;
          }
        } while (iVar6 < 0xd);
      }
      auVar4 = (uchar  [4])((int)auStack_1c3c + 1);
      bVar41 = (int)auStack_1c3c < 0xc;
      auStack_1c3c = auVar4;
    } while (bVar41);
    uStack_1c48 = uStack_1c48 + 1;
  } while (uStack_1c48 != 0xd);
  psStack_1c28 = (secp256k1_context *)0x1;
  uStack_1c38 = 0;
  do {
    psVar28 = psStack_1c28 + -1;
    lVar10 = (long)&psVar28->field_0xc7 * 0x20;
    auStack_1c10 = *(undefined1 (*) [16])(auStack_1950 + lVar10);
    iVar5 = 0xd - (int)psStack_1c28;
    if ((&uStack_1b74)[(long)psStack_1c28] == 0) {
      iVar5 = (int)psStack_1c28;
    }
    puStack_1c30 = (undefined1 *)CONCAT44(puStack_1c30._4_4_,iVar5);
    auStack_1c20._8_8_ = *(undefined8 *)(auStack_1960 + lVar10 + 8);
    auStack_1c20._0_8_ = *(undefined8 *)(auStack_1960 + lVar10);
    puStack_1c50 = (undefined1 *)0x1;
    do {
      auStack_1bd0 = (undefined1  [16])0x0;
      auStack_1be0 = (undefined1  [16])0x0;
      auStack_1bf0 = (undefined1  [16])0x0;
      uStack_1bc0 = 0;
      bVar41 = true;
      if ((ulong)num_cores != 1) {
        uStack_1c38 = uStack_1c38 + 0xe7037ed1a0b428db;
        bVar41 = (uint32_t)
                 ((uStack_1c38 >> 0x20 ^ uStack_1c38 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar41) {
        iVar5 = (int)puStack_1c50;
        if (puStack_1c50 < 7) {
          lVar10 = ((long)puStack_1c50 - 1U) * 0x20;
          auStack_1af0 = *(undefined1 (*) [16])(auStack_1950 + lVar10);
          sStack_1b00.data = *(void **)(auStack_1960 + lVar10 + 8);
          sStack_1b00.fn = *(_func_void_char_ptr_void_ptr **)(auStack_1960 + lVar10);
          iVar6 = 0xd - iVar5;
          if ((&uStack_1b74)[(long)puStack_1c50] == 0) {
            iVar6 = iVar5;
          }
        }
        else {
          sStack_1b00 = *(secp256k1_callback *)(invalid_pubkey_bytes + (iVar5 - 7U));
          auStack_1af0 = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar5 - 7U] + 0x10);
          iVar6 = -1;
        }
        iVar5 = 0;
        do {
          testrand256(auStack_1b40);
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1bb0,(uchar *)&sStack_1b00,auStack_1b40,0x20,
                     auStack_1c20);
          uVar9 = auStack_1bb0._0_8_ & 0xffffffff;
          if (*(int *)(auStack_1bf0 + uVar9 * 4) == 0) {
            uVar24 = auStack_1bb0._0_4_ * (int)puStack_1c30 + iVar6;
            iVar22 = 0;
            uVar20 = 0;
            do {
              if (iVar22 == 0xe) {
                testrand256(auStack_1ae0);
                uVar36 = 0;
              }
              else {
                auStack_1ae0 = (undefined1  [16])0x0;
                sStack_1ad0._0_12_ = SUB1612((undefined1  [16])0x0,0);
                sStack_1ad0.data._4_4_ = 0;
                uVar36 = 0;
                if (iVar22 != 0xd && iVar6 != -1) {
                  uVar36 = (uint)(uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc) == iVar22);
                }
              }
              psVar29 = psStack_1c58;
              uVar8 = secp256k1_schnorrsig_verify
                                (psStack_1c58,(uchar *)&sStack_1b00,auStack_1b40,0x20,
                                 (secp256k1_xonly_pubkey *)
                                 (auStack_11e0 + (long)&psVar28->field_0xc7 * 0x40));
              if (uVar8 != uVar36) goto LAB_00117f78;
              uVar20 = uVar20 + uVar8;
              iVar22 = iVar22 + 1;
            } while (iVar22 != 0xf);
            if (uVar20 != (iVar6 != -1)) goto LAB_00117f7d;
            *(undefined4 *)(auStack_1bf0 + uVar9 * 4) = 1;
            iVar5 = iVar5 + 1;
          }
        } while (iVar5 < 0xd);
      }
      puStack_1c50 = (undefined1 *)((long)puStack_1c50 + 1);
    } while (puStack_1c50 != (undefined1 *)0xe);
    psStack_1c28 = (secp256k1_context *)((long)&(psStack_1c28->ecmult_gen_ctx).built + 1);
  } while (psStack_1c28 != (secp256k1_context *)0x7);
  lVar10 = 0x68;
  iVar5 = 1;
  do {
    auStack_1bf0._0_4_ = iVar5;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1bf0);
    sStack_1b00.fn = (_func_void_char_ptr_void_ptr *)0x0;
    sStack_1b00.data = (void *)0x0;
    auStack_1af0._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1af0[0xf] = (char)iVar5;
    psVar29 = psStack_1c58;
    iVar6 = secp256k1_ellswift_create(psStack_1c58,auStack_11e0,(uchar *)&sStack_1b00,(uchar *)0x0);
    if (iVar6 == 0) goto LAB_00117f82;
    secp256k1_ellswift_decode(psStack_1c58,(secp256k1_pubkey *)auStack_1960,auStack_11e0);
    psVar29 = asStack_1660;
    secp256k1_pubkey_load(psStack_1c58,(secp256k1_ge *)psVar29,(secp256k1_pubkey *)auStack_1960);
    iVar6 = secp256k1_ge_eq_var((secp256k1_ge *)psVar29,(secp256k1_ge *)(auStack_ee0 + lVar10));
    if (iVar6 == 0) goto LAB_00117f87;
    lVar10 = lVar10 + 0x68;
    iVar5 = iVar5 + 1;
  } while (lVar10 != 0x548);
  secp256k1_context_destroy(psStack_1c58);
  iVar5 = count;
  goto joined_r0x00116214;
LAB_00117e6f:
  main_cold_3();
LAB_00117e74:
  main_cold_4();
LAB_00117e79:
  main_cold_5();
LAB_00117e7e:
  main_cold_60();
LAB_00117e83:
  main_cold_59();
LAB_00117e88:
  main_cold_58();
LAB_00117e8d:
  main_cold_6();
LAB_00117e92:
  main_cold_7();
LAB_00117e97:
  main_cold_41();
LAB_00117e9c:
  main_cold_52();
LAB_00117ea1:
  main_cold_51();
LAB_00117ea6:
  main_cold_50();
LAB_00117eab:
  main_cold_49();
LAB_00117eb0:
  main_cold_47();
LAB_00117eb5:
  psVar30 = psVar28;
  main_cold_46();
LAB_00117eba:
  main_cold_45();
LAB_00117ebf:
  psVar29 = psVar30;
  main_cold_43();
LAB_00117ec4:
  main_cold_42();
LAB_00117ec9:
  main_cold_62();
LAB_00117ece:
  main_cold_61();
LAB_00117ed3:
  main_cold_57();
LAB_00117ed8:
  main_cold_56();
  goto LAB_00117edd;
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
    secp256k1_ecmult_const(&rj, &p, q);
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}